

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

char * crn_get_mip_mode_desc(crn_mip_mode m)

{
  crn_mip_mode m_local;
  char *local_8;
  
  switch(m) {
  case cCRNMipModeUseSourceOrGenerateMips:
    local_8 = "Use source/generate if none";
    break;
  case cCRNMipModeUseSourceMips:
    local_8 = "Only use source MIP maps (if any)";
    break;
  case cCRNMipModeGenerateMips:
    local_8 = "Always generate new MIP maps";
    break;
  case cCRNMipModeNoMips:
    local_8 = "No MIP maps";
    break;
  default:
    local_8 = "?";
  }
  return local_8;
}

Assistant:

const char* crn_get_mip_mode_desc(crn_mip_mode m) {
  switch (m) {
    case cCRNMipModeUseSourceOrGenerateMips:
      return "Use source/generate if none";
    case cCRNMipModeUseSourceMips:
      return "Only use source MIP maps (if any)";
    case cCRNMipModeGenerateMips:
      return "Always generate new MIP maps";
    case cCRNMipModeNoMips:
      return "No MIP maps";
    default:
      break;
  }
  return "?";
}